

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaDec.c
# Opt level: O3

ELzmaDummy LzmaDec_TryDummy(CLzmaDec *p,Byte *buf,Byte **bufOut)

{
  byte bVar1;
  byte *pbVar2;
  uint symbol;
  uint uVar3;
  ELzmaDummy EVar4;
  ulong uVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  SizeT SVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  CLzmaProb *pCVar15;
  uint uVar16;
  UInt32 UVar17;
  uint uVar18;
  uint uVar19;
  long lVar20;
  
  uVar11 = p->range;
  UVar17 = p->code;
  pbVar2 = *bufOut;
  pCVar15 = p->probs_1664;
  uVar3 = p->state;
  uVar18 = p->processedPos;
  uVar8 = (~(-1 << ((p->prop).pb & 0x1f)) & uVar18) * 0x10;
  if (uVar11 < 0x1000000) {
    if (buf < pbVar2) {
      uVar11 = uVar11 << 8;
      bVar1 = *buf;
      buf = buf + 1;
      UVar17 = UVar17 << 8 | (uint)bVar1;
      goto LAB_0014ae33;
    }
    goto LAB_0014b3ce;
  }
LAB_0014ae33:
  uVar16 = (uVar11 >> 0xb) * (uint)pCVar15[(ulong)(uVar8 + uVar3) - 0x100];
  uVar6 = UVar17 - uVar16;
  if (UVar17 < uVar16) {
    pCVar15 = pCVar15 + 0x140;
    if (p->checkDicSize != 0 || uVar18 != 0) {
      bVar1 = (p->prop).lc;
      SVar10 = p->dicPos;
      if (SVar10 == 0) {
        SVar10 = p->dicBufSize;
      }
      pCVar15 = pCVar15 + ((uint)(p->dic[SVar10 - 1] >> (8 - bVar1 & 0x1f)) +
                          ((uVar18 & ~(-1 << ((p->prop).lp & 0x1f))) << (bVar1 & 0x1f))) * 0x300;
    }
    if (uVar3 < 7) {
      uVar5 = 1;
      do {
        if (uVar16 < 0x1000000) {
          if (pbVar2 <= buf) goto LAB_0014b3ce;
          uVar16 = uVar16 << 8;
          bVar1 = *buf;
          buf = buf + 1;
          UVar17 = UVar17 << 8 | (uint)bVar1;
        }
        uVar11 = (uVar16 >> 0xb) * (uint)pCVar15[uVar5];
        if (UVar17 < uVar11) {
          uVar3 = (int)uVar5 * 2;
          uVar16 = uVar11;
        }
        else {
          uVar16 = uVar16 - uVar11;
          uVar3 = (int)uVar5 * 2 + 1;
          UVar17 = UVar17 - uVar11;
        }
        uVar5 = (ulong)uVar3;
      } while (uVar3 < 0x100);
    }
    else {
      if (p->dicPos < (ulong)p->reps[0]) {
        SVar10 = p->dicBufSize;
      }
      else {
        SVar10 = 0;
      }
      uVar3 = (uint)p->dic[SVar10 + (p->dicPos - (ulong)p->reps[0])];
      uVar11 = 1;
      uVar18 = 0x100;
      do {
        uVar3 = uVar3 * 2;
        uVar6 = uVar18 & uVar3;
        uVar8 = uVar16;
        if (uVar16 < 0x1000000) {
          if (pbVar2 <= buf) goto LAB_0014b3ce;
          uVar8 = uVar16 << 8;
          bVar1 = *buf;
          buf = buf + 1;
          UVar17 = UVar17 << 8 | (uint)bVar1;
        }
        uVar16 = (uVar8 >> 0xb) * (uint)pCVar15[uVar18 + uVar11 + uVar6];
        uVar12 = UVar17 - uVar16;
        if (UVar17 < uVar16) {
          uVar11 = uVar11 * 2;
          uVar18 = uVar6 ^ uVar18;
        }
        else {
          uVar16 = uVar8 - uVar16;
          uVar11 = uVar11 * 2 + 1;
          UVar17 = uVar12;
          uVar18 = uVar6;
        }
      } while (uVar11 < 0x100);
    }
    EVar4 = DUMMY_LIT;
LAB_0014b0e2:
    if (uVar16 < 0x1000000) {
      if (pbVar2 <= buf) goto LAB_0014b3ce;
      buf = buf + 1;
    }
    *bufOut = buf;
  }
  else {
    uVar11 = uVar11 - uVar16;
    if (uVar11 < 0x1000000) {
      if (pbVar2 <= buf) goto LAB_0014b3ce;
      uVar11 = uVar11 * 0x100;
      bVar1 = *buf;
      buf = buf + 1;
      uVar6 = uVar6 * 0x100 | (uint)bVar1;
    }
    uVar18 = (uVar11 >> 0xb) * (uint)pCVar15[(ulong)uVar3 + 0x10];
    uVar12 = uVar6 - uVar18;
    if (uVar6 < uVar18) {
      EVar4 = DUMMY_MATCH;
      lVar20 = -0x600;
      uVar19 = uVar18;
      uVar14 = uVar6;
LAB_0014af57:
      if (uVar19 < 0x1000000) {
        if (pbVar2 <= buf) goto LAB_0014b3ce;
        uVar19 = uVar19 << 8;
        bVar1 = *buf;
        buf = buf + 1;
        uVar14 = uVar14 << 8 | (uint)bVar1;
      }
      uVar16 = (uVar19 >> 0xb) * (uint)*(ushort *)((long)pCVar15 + lVar20);
      uVar11 = uVar14 - uVar16;
      if (uVar14 < uVar16) {
        lVar20 = (long)pCVar15 + (ulong)uVar8 * 2 + lVar20;
        iVar7 = 0;
        uVar3 = 8;
      }
      else {
        uVar19 = uVar19 - uVar16;
        if (uVar19 < 0x1000000) {
          if (pbVar2 <= buf) goto LAB_0014b3ce;
          uVar19 = uVar19 * 0x100;
          bVar1 = *buf;
          buf = buf + 1;
          uVar11 = (uint)bVar1 | uVar11 * 0x100;
        }
        uVar16 = (uVar19 >> 0xb) * (uint)*(ushort *)((long)pCVar15 + lVar20 + 0x10);
        uVar14 = uVar11 - uVar16;
        if (uVar11 < uVar16) {
          lVar20 = (long)pCVar15 + (ulong)uVar8 * 2 + lVar20 + 0x10;
          uVar3 = 8;
          iVar7 = 8;
          uVar14 = uVar11;
        }
        else {
          uVar16 = uVar19 - uVar16;
          lVar20 = (long)pCVar15 + lVar20 + 0x200;
          iVar7 = 0x10;
          uVar3 = 0x100;
        }
      }
      uVar5 = 1;
      do {
        uVar11 = uVar16;
        if (uVar16 < 0x1000000) {
          if (pbVar2 <= buf) goto LAB_0014b3ce;
          uVar11 = uVar16 << 8;
          bVar1 = *buf;
          buf = buf + 1;
          uVar14 = uVar14 << 8 | (uint)bVar1;
        }
        uVar16 = (uVar11 >> 0xb) * (uint)*(ushort *)(lVar20 + uVar5 * 2);
        uVar8 = uVar14 - uVar16;
        if (uVar14 < uVar16) {
          uVar11 = (int)uVar5 * 2;
        }
        else {
          uVar16 = uVar11 - uVar16;
          uVar11 = (int)uVar5 * 2 + 1;
          uVar14 = uVar8;
        }
        uVar5 = (ulong)uVar11;
      } while (uVar11 < uVar3);
      if (uVar6 < uVar18) {
        uVar11 = (iVar7 - uVar3) + uVar11;
        uVar3 = 3;
        if (uVar11 < 3) {
          uVar3 = uVar11;
        }
        uVar5 = 1;
        do {
          uVar11 = uVar16;
          if (uVar16 < 0x1000000) {
            if (pbVar2 <= buf) goto LAB_0014b3ce;
            uVar11 = uVar16 << 8;
            bVar1 = *buf;
            buf = buf + 1;
            uVar14 = uVar14 << 8 | (uint)bVar1;
          }
          uVar16 = (uVar11 >> 0xb) *
                   (uint)*(ushort *)((long)pCVar15 + uVar5 * 2 + (ulong)(uVar3 << 7) + 0x80);
          uVar18 = uVar14 - uVar16;
          if (uVar14 < uVar16) {
            uVar11 = (int)uVar5 * 2;
          }
          else {
            uVar16 = uVar11 - uVar16;
            uVar11 = (int)uVar5 * 2 + 1;
            uVar14 = uVar18;
          }
          uVar5 = (ulong)uVar11;
        } while (uVar11 < 0x40);
        uVar3 = uVar11 - 0x40;
        if (3 < uVar3) {
          if (uVar3 < 0xe) {
            iVar7 = (uVar3 >> 1) - 1;
            pCVar15 = pCVar15 + ((ulong)((uVar11 & 1 | 2) << ((byte)iVar7 & 0x1f)) - 0x680);
          }
          else {
            iVar7 = (uVar3 >> 1) - 5;
            do {
              if (uVar16 < 0x1000000) {
                if (pbVar2 <= buf) goto LAB_0014b3ce;
                uVar16 = uVar16 << 8;
                bVar1 = *buf;
                buf = buf + 1;
                uVar14 = uVar14 << 8 | (uint)bVar1;
              }
              uVar16 = uVar16 >> 1;
              uVar11 = 0;
              if (-1 < (int)(uVar14 - uVar16)) {
                uVar11 = uVar16;
              }
              uVar14 = uVar14 - uVar11;
              iVar7 = iVar7 + -1;
            } while (iVar7 != 0);
            iVar7 = 4;
          }
          uVar11 = 1;
          iVar13 = 1;
          do {
            uVar3 = uVar16;
            if (uVar16 < 0x1000000) {
              if (pbVar2 <= buf) goto LAB_0014b3ce;
              uVar3 = uVar16 << 8;
              bVar1 = *buf;
              buf = buf + 1;
              uVar14 = uVar14 << 8 | (uint)bVar1;
            }
            uVar16 = (uVar3 >> 0xb) * (uint)pCVar15[uVar11];
            uVar18 = uVar14 - uVar16;
            iVar9 = iVar13;
            if (uVar16 <= uVar14) {
              uVar16 = uVar3 - uVar16;
              iVar9 = iVar13 * 2;
              uVar14 = uVar18;
            }
            iVar13 = iVar13 * 2;
            uVar11 = uVar11 + iVar9;
            iVar7 = iVar7 + -1;
          } while (iVar7 != 0);
        }
      }
      goto LAB_0014b0e2;
    }
    uVar11 = uVar11 - uVar18;
    if (uVar11 < 0x1000000) {
      if (pbVar2 <= buf) goto LAB_0014b3ce;
      uVar11 = uVar11 * 0x100;
      bVar1 = *buf;
      buf = buf + 1;
      uVar12 = uVar12 * 0x100 | (uint)bVar1;
    }
    uVar19 = (uVar11 >> 0xb) * (uint)pCVar15[(ulong)uVar3 + 0x1c];
    uVar14 = uVar12 - uVar19;
    if (uVar19 <= uVar12) {
      uVar11 = uVar11 - uVar19;
      if (uVar11 < 0x1000000) {
        if (pbVar2 <= buf) goto LAB_0014b3ce;
        uVar11 = uVar11 * 0x100;
        bVar1 = *buf;
        buf = buf + 1;
        uVar14 = uVar14 * 0x100 | (uint)bVar1;
      }
      uVar19 = (uVar11 >> 0xb) * (uint)pCVar15[(ulong)uVar3 + 0x28];
      EVar4 = DUMMY_REP;
      lVar20 = -0xa00;
      uVar16 = uVar14 - uVar19;
      if (uVar19 <= uVar14) {
        uVar11 = uVar11 - uVar19;
        if (uVar11 < 0x1000000) {
          if (pbVar2 <= buf) goto LAB_0014b3ce;
          uVar11 = uVar11 * 0x100;
          bVar1 = *buf;
          buf = buf + 1;
          uVar16 = uVar16 * 0x100 | (uint)bVar1;
        }
        uVar19 = (uVar11 >> 0xb) * (uint)pCVar15[(ulong)uVar3 + 0x34];
        uVar3 = uVar16 - uVar19;
        uVar14 = uVar16;
        if (uVar19 <= uVar16) {
          uVar19 = uVar11 - uVar19;
          uVar14 = uVar3;
        }
      }
      goto LAB_0014af57;
    }
    if (0xffffff < uVar19) {
LAB_0014b036:
      uVar16 = (uVar19 >> 0xb) * (uint)pCVar15[(ulong)(uVar8 + uVar3) - 0x600];
      EVar4 = DUMMY_REP;
      if (uVar12 < uVar16) goto LAB_0014b0e2;
      uVar19 = uVar19 - uVar16;
      lVar20 = -0xa00;
      uVar14 = uVar12 - uVar16;
      goto LAB_0014af57;
    }
    if (buf < pbVar2) {
      uVar19 = uVar19 * 0x100;
      bVar1 = *buf;
      buf = buf + 1;
      uVar12 = uVar12 << 8 | (uint)bVar1;
      goto LAB_0014b036;
    }
LAB_0014b3ce:
    EVar4 = DUMMY_INPUT_EOF;
  }
  return EVar4;
}

Assistant:

static ELzmaDummy LzmaDec_TryDummy(const CLzmaDec *p, const Byte *buf, const Byte **bufOut)
{
  UInt32 range = p->range;
  UInt32 code = p->code;
  const Byte *bufLimit = *bufOut;
  const CLzmaProb *probs = GET_PROBS;
  unsigned state = (unsigned)p->state;
  ELzmaDummy res;

  for (;;)
  {
    const CLzmaProb *prob;
    UInt32 bound;
    unsigned ttt;
    unsigned posState = CALC_POS_STATE(p->processedPos, ((unsigned)1 << p->prop.pb) - 1);

    prob = probs + IsMatch + COMBINED_PS_STATE;
    IF_BIT_0_CHECK(prob)
    {
      UPDATE_0_CHECK

      prob = probs + Literal;
      if (p->checkDicSize != 0 || p->processedPos != 0)
        prob += ((UInt32)LZMA_LIT_SIZE *
            ((((p->processedPos) & (((unsigned)1 << (p->prop.lp)) - 1)) << p->prop.lc) +
            ((unsigned)p->dic[(p->dicPos == 0 ? p->dicBufSize : p->dicPos) - 1] >> (8 - p->prop.lc))));

      if (state < kNumLitStates)
      {
        unsigned symbol = 1;
        do { GET_BIT_CHECK(prob + symbol, symbol) } while (symbol < 0x100);
      }
      else
      {
        unsigned matchByte = p->dic[p->dicPos - p->reps[0] +
            (p->dicPos < p->reps[0] ? p->dicBufSize : 0)];
        unsigned offs = 0x100;
        unsigned symbol = 1;
        do
        {
          unsigned bit;
          const CLzmaProb *probLit;
          matchByte += matchByte;
          bit = offs;
          offs &= matchByte;
          probLit = prob + (offs + bit + symbol);
          GET_BIT2_CHECK(probLit, symbol, offs ^= bit; , ; )
        }
        while (symbol < 0x100);
      }
      res = DUMMY_LIT;
    }
    else
    {
      unsigned len;
      UPDATE_1_CHECK

      prob = probs + IsRep + state;
      IF_BIT_0_CHECK(prob)
      {
        UPDATE_0_CHECK
        state = 0;
        prob = probs + LenCoder;
        res = DUMMY_MATCH;
      }
      else
      {
        UPDATE_1_CHECK
        res = DUMMY_REP;
        prob = probs + IsRepG0 + state;
        IF_BIT_0_CHECK(prob)
        {
          UPDATE_0_CHECK
          prob = probs + IsRep0Long + COMBINED_PS_STATE;
          IF_BIT_0_CHECK(prob)
          {
            UPDATE_0_CHECK
            break;
          }
          else
          {
            UPDATE_1_CHECK
          }
        }
        else
        {
          UPDATE_1_CHECK
          prob = probs + IsRepG1 + state;
          IF_BIT_0_CHECK(prob)
          {
            UPDATE_0_CHECK
          }
          else
          {
            UPDATE_1_CHECK
            prob = probs + IsRepG2 + state;
            IF_BIT_0_CHECK(prob)
            {
              UPDATE_0_CHECK
            }
            else
            {
              UPDATE_1_CHECK
            }
          }
        }
        state = kNumStates;
        prob = probs + RepLenCoder;
      }